

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void BeginVisitCatch(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *this;
  FuncInfo *this_00;
  uint uVar1;
  ParseNodeCatch *pPVar2;
  
  pPVar2 = ParseNode::AsParseNodeCatch(pnode);
  this = pPVar2->scope;
  this_00 = this->func;
  if (((this_00->field_0xb4 & 6) != 0) || ((byteCodeGenerator->flags & 0x404) != 0)) {
    Scope::SetIsObject(this);
  }
  uVar1 = FuncInfo::AcquireInnerScopeIndex(this_00);
  this->innerScopeIndex = uVar1;
  pPVar2 = ParseNode::AsParseNodeCatch(pnode);
  ByteCodeGenerator::PushScope(byteCodeGenerator,pPVar2->scope);
  return;
}

Assistant:

void BeginVisitCatch(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Scope *scope = pnode->AsParseNodeCatch()->scope;
    FuncInfo *func = scope->GetFunc();

    if (func->GetCallsEval() || func->GetChildCallsEval() ||
        (byteCodeGenerator->GetFlags() & (fscrEval | fscrImplicitThis)))
    {
        scope->SetIsObject();
    }

    // Give this scope an index so its slots can be accessed via the index in the byte code,
    // not a register.
    scope->SetInnerScopeIndex(func->AcquireInnerScopeIndex());

    byteCodeGenerator->PushScope(pnode->AsParseNodeCatch()->scope);
}